

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_pool.c
# Opt level: O0

upb_DefPool * upb_DefPool_New(void)

{
  _Bool _Var1;
  upb_Arena *puVar2;
  void *pvVar3;
  upb_ExtensionRegistry *puVar4;
  undefined1 local_218 [8];
  upb_Status status;
  upb_DefPool *s;
  
  status.msg._503_8_ = upb_gmalloc(0xb0);
  if ((void *)status.msg._503_8_ != (void *)0x0) {
    puVar2 = upb_Arena_New();
    *(upb_Arena **)status.msg._503_8_ = puVar2;
    *(undefined8 *)(status.msg._503_8_ + 0xa8) = 0;
    *(undefined8 *)(status.msg._503_8_ + 0xa0) = 0xf0;
    pvVar3 = upb_gmalloc(*(size_t *)(status.msg._503_8_ + 0xa0));
    *(void **)(status.msg._503_8_ + 0x98) = pvVar3;
    if ((((*(long *)(status.msg._503_8_ + 0x98) != 0) &&
         (_Var1 = upb_strtable_init((upb_strtable *)(status.msg._503_8_ + 8),0x20,
                                    *(upb_Arena **)status.msg._503_8_), _Var1)) &&
        (_Var1 = upb_strtable_init((upb_strtable *)(status.msg._503_8_ + 0x28),4,
                                   *(upb_Arena **)status.msg._503_8_), _Var1)) &&
       (_Var1 = upb_inttable_init((upb_inttable *)(status.msg._503_8_ + 0x48),
                                  *(upb_Arena **)status.msg._503_8_), _Var1)) {
      puVar4 = upb_ExtensionRegistry_New(*(upb_Arena **)status.msg._503_8_);
      *(upb_ExtensionRegistry **)(status.msg._503_8_ + 0x80) = puVar4;
      if (*(long *)(status.msg._503_8_ + 0x80) != 0) {
        *(undefined4 *)(status.msg._503_8_ + 0x90) = 1;
        _Var1 = upb_DefPool_SetFeatureSetDefaults
                          ((upb_DefPool *)status.msg._503_8_,serialized_defaults,0x45,
                           (upb_Status *)local_218);
        if ((_Var1) && (*(long *)(status.msg._503_8_ + 0x88) != 0)) {
          return (upb_DefPool *)status.msg._503_8_;
        }
      }
    }
    upb_DefPool_Free((upb_DefPool *)status.msg._503_8_);
  }
  return (upb_DefPool *)0x0;
}

Assistant:

upb_DefPool* upb_DefPool_New(void) {
  upb_DefPool* s = upb_gmalloc(sizeof(*s));
  if (!s) return NULL;

  s->arena = upb_Arena_New();
  s->bytes_loaded = 0;

  s->scratch_size = 240;
  s->scratch_data = upb_gmalloc(s->scratch_size);
  if (!s->scratch_data) goto err;

  if (!upb_strtable_init(&s->syms, 32, s->arena)) goto err;
  if (!upb_strtable_init(&s->files, 4, s->arena)) goto err;
  if (!upb_inttable_init(&s->exts, s->arena)) goto err;

  s->extreg = upb_ExtensionRegistry_New(s->arena);
  if (!s->extreg) goto err;

  s->platform = kUpb_MiniTablePlatform_Native;

  upb_Status status;
  if (!upb_DefPool_SetFeatureSetDefaults(
          s, serialized_defaults, sizeof(serialized_defaults) - 1, &status)) {
    goto err;
  }

  if (!s->feature_set_defaults) goto err;

  return s;

err:
  upb_DefPool_Free(s);
  return NULL;
}